

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

void sync_queries(vw *all,svm_params *params,bool *train_pool)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  unsigned_long *__ptr;
  char **ppcVar5;
  flat_example **ppfVar6;
  vw *all_00;
  char *pcVar7;
  svm_example *psVar8;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  size_t i_2;
  size_t num_read;
  size_t i_1;
  size_t total_sum;
  size_t prev_sum;
  size_t *sizes;
  size_t i;
  flat_example *fec;
  char *queries;
  io_buf *b;
  size_t in_stack_00000108;
  flat_example *in_stack_ffffffffffffff38;
  svm_example *in_stack_ffffffffffffff40;
  unsigned_long *in_stack_ffffffffffffff48;
  char *buffer;
  vw *in_stack_ffffffffffffff50;
  ulong local_78;
  long local_70;
  ulong local_68;
  long local_60;
  long local_58;
  ulong local_48;
  void *local_40;
  flat_example **in_stack_ffffffffffffffc8;
  flat_example **fec_00;
  undefined1 in_stack_ffffffffffffffd7;
  io_buf *in_stack_ffffffffffffffd8;
  
  plVar4 = (long *)operator_new(0xa8);
  io_buf::io_buf((io_buf *)0x322e69);
  local_40 = (void *)0x0;
  for (local_48 = 0; local_48 < *(ulong *)(in_RSI + 0x20); local_48 = local_48 + 1) {
    if ((*(byte *)(in_RDX + local_48) & 1) != 0) {
      local_40 = (void *)(*(long *)(*(long *)(in_RSI + 0x48) + local_48 * 8) + 0x20);
      save_load_flat_example
                (in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7,in_stack_ffffffffffffffc8
                );
      pvVar1 = *(void **)(*(long *)(in_RSI + 0x48) + local_48 * 8);
      if (pvVar1 != (void *)0x0) {
        svm_example::~svm_example((svm_example *)in_stack_ffffffffffffff50);
        operator_delete(pvVar1);
      }
    }
  }
  __ptr = calloc_or_throw<unsigned_long>(in_stack_00000108);
  lVar2 = plVar4[0xc];
  ppcVar5 = v_array<char>::begin((v_array<char> *)(plVar4 + 2));
  __ptr[*(long *)(*(long *)(in_RDI + 0x20) + 0x10)] = lVar2 - (long)*ppcVar5;
  all_reduce<unsigned_long,_&add_size_t>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40);
  local_58 = 0;
  local_60 = 0;
  for (local_68 = 0; local_68 < *(ulong *)(*(long *)(in_RDI + 0x20) + 8); local_68 = local_68 + 1) {
    if (local_68 <= *(long *)(*(long *)(in_RDI + 0x20) + 0x10) - 1U) {
      local_58 = __ptr[local_68] + local_58;
    }
    local_60 = __ptr[local_68] + local_60;
  }
  if (local_60 != 0) {
    ppfVar6 = (flat_example **)calloc_or_throw<char>(in_stack_00000108);
    all_00 = (vw *)((long)ppfVar6 + local_58);
    ppcVar5 = v_array<char>::begin((v_array<char> *)(plVar4 + 2));
    pcVar7 = *ppcVar5;
    buffer = (char *)plVar4[0xc];
    ppcVar5 = v_array<char>::begin((v_array<char> *)(plVar4 + 2));
    memcpy(all_00,pcVar7,(long)buffer - (long)*ppcVar5);
    v_array<char>::delete_v((v_array<char> *)in_stack_ffffffffffffff40);
    all_reduce<char,_&copy_char>(all_00,buffer,(size_t)in_stack_ffffffffffffff40);
    fec_00 = ppfVar6;
    ppcVar5 = v_array<char>::begin((v_array<char> *)(plVar4 + 2));
    *ppcVar5 = (char *)ppfVar6;
    ppcVar5 = v_array<char>::begin((v_array<char> *)(plVar4 + 2));
    plVar4[0xc] = (long)*ppcVar5;
    pcVar7 = (char *)((long)fec_00 + local_60);
    ppcVar5 = v_array<char>::end((v_array<char> *)(plVar4 + 2));
    *ppcVar5 = pcVar7;
    local_70 = 0;
    *(undefined8 *)(in_RSI + 0x20) = 0;
    local_78 = 0;
    while ((local_78 < *(ulong *)(in_RSI + 0x18) &&
           (iVar3 = save_load_flat_example
                              (in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7,fec_00),
           iVar3 == 0))) {
      psVar8 = calloc_or_throw<svm_example>();
      *(svm_example **)(*(long *)(in_RSI + 0x48) + local_78 * 8) = psVar8;
      svm_example::init_svm_example(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      *(undefined1 *)(in_RDX + local_78) = 1;
      *(long *)(in_RSI + 0x20) = *(long *)(in_RSI + 0x20) + 1;
      in_stack_ffffffffffffff40 = (svm_example *)plVar4[0xc];
      ppcVar5 = v_array<char>::begin((v_array<char> *)(plVar4 + 2));
      local_70 = (long)in_stack_ffffffffffffff40 + (local_70 - (long)*ppcVar5);
      if (local_70 == local_58) {
        *(ulong *)(in_RSI + 0x68) = local_78 + 1;
      }
      if (local_70 == local_58 + __ptr[*(long *)(*(long *)(in_RDI + 0x20) + 0x10)]) {
        *(ulong *)(in_RSI + 0x70) = local_78;
      }
      local_78 = local_78 + 1;
    }
  }
  if (local_40 != (void *)0x0) {
    free(local_40);
  }
  free(__ptr);
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 0x18))();
  }
  return;
}

Assistant:

void sync_queries(vw& all, svm_params& params, bool* train_pool)
{
  io_buf* b = new io_buf();

  char* queries;
  flat_example* fec = nullptr;

  for (size_t i = 0; i < params.pool_pos; i++)
  {
    if (!train_pool[i])
      continue;

    fec = &(params.pool[i]->ex);
    save_load_flat_example(*b, false, fec);
    delete params.pool[i];
  }

  size_t* sizes = calloc_or_throw<size_t>(all.all_reduce->total);
  sizes[all.all_reduce->node] = b->head - b->space.begin();
  // params.all->opts_n_args.trace_message<<"Sizes = "<<sizes[all.node]<<" ";
  all_reduce<size_t, add_size_t>(all, sizes, all.all_reduce->total);

  size_t prev_sum = 0, total_sum = 0;
  for (size_t i = 0; i < all.all_reduce->total; i++)
  {
    if (i <= (all.all_reduce->node - 1))
      prev_sum += sizes[i];
    total_sum += sizes[i];
  }

  // params.all->opts_n_args.trace_message<<total_sum<<" "<<prev_sum<<endl;
  if (total_sum > 0)
  {
    queries = calloc_or_throw<char>(total_sum);
    memcpy(queries + prev_sum, b->space.begin(), b->head - b->space.begin());
    b->space.delete_v();
    all_reduce<char, copy_char>(all, queries, total_sum);

    b->space.begin() = queries;
    b->head = b->space.begin();
    b->space.end() = &queries[total_sum * sizeof(char)];

    size_t num_read = 0;
    params.pool_pos = 0;

    for (size_t i = 0; i < params.pool_size; i++)
    {
      if (!save_load_flat_example(*b, true, fec))
      {
        params.pool[i] = &calloc_or_throw<svm_example>();
        params.pool[i]->init_svm_example(fec);
        train_pool[i] = true;
        params.pool_pos++;
        // for(int j = 0;j < fec->feature_map_len;j++)
        //   params.all->opts_n_args.trace_message<<fec->feature_map[j].weight_index<<":"<<fec->feature_map[j].x<<" ";
        // params.all->opts_n_args.trace_message<<endl;
        // params.pool[i]->in_use = true;
        // params.current_t += ((label_data*) params.pool[i]->ld)->weight;
        // params.pool[i]->example_t = params.current_t;
      }
      else
        break;

      num_read += b->head - b->space.begin();
      if (num_read == prev_sum)
        params.local_begin = i + 1;
      if (num_read == prev_sum + sizes[all.all_reduce->node])
        params.local_end = i;
    }
  }
  if (fec)
    free(fec);
  free(sizes);
  delete b;
}